

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage_Test::
testBody(TEST_MockCheckedActualCall_actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage_Test
         *this)

{
  int iVar1;
  MockActualCall *pMVar2;
  undefined4 extraout_var;
  UtestShell *test;
  SimpleString local_150;
  undefined1 local_140 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  SimpleString local_c8;
  MockNamedValue local_b8;
  undefined1 local_68 [8];
  MockCheckedActualCall actualCall;
  TEST_MockCheckedActualCall_actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage_Test
  *this_local;
  
  actualCall.outputParameterExpectations_ = (MockOutputParametersListNode *)this;
  MockCheckedActualCall::MockCheckedActualCall
            ((MockCheckedActualCall *)local_68,1,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).emptyList);
  SimpleString::SimpleString(&local_c8,"noreturn");
  pMVar2 = MockCheckedActualCall::withName((MockCheckedActualCall *)local_68,&local_c8);
  iVar1 = (*pMVar2->_vptr_MockActualCall[3])(pMVar2,0);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xa8))(&local_b8);
  MockNamedValue::~MockNamedValue(&local_b8);
  SimpleString::~SimpleString(&local_c8);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_150,"noreturn");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_140,test,&local_150,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_150);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_140,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x69);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_140);
  MockCheckedActualCall::~MockCheckedActualCall((MockCheckedActualCall *)local_68);
  return;
}

Assistant:

TEST(MockCheckedActualCall, actualCallWithNoReturnValueAndMeaninglessCallOrderForCoverage)
{
    MockCheckedActualCall actualCall(1, reporter, *emptyList);
    actualCall.withName("noreturn").withCallOrder(0).returnValue();

    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "noreturn", *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}